

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  uint x;
  uint y;
  stbi_uc *psVar4;
  char *pcVar5;
  byte *pbVar6;
  long lVar7;
  uchar *puVar8;
  stbi_uc *psVar9;
  uint uVar10;
  byte *pbVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint *puVar18;
  uint uVar19;
  byte *pbVar20;
  byte bVar21;
  uint uVar22;
  long in_FS_OFFSET;
  bool bVar23;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  stbi_uc local_ac [4];
  stbi_uc *local_a8;
  uchar *local_a0;
  uint *local_98;
  long local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  psVar4 = s->img_buffer;
  iVar14 = 0x5c;
  local_60 = (uint *)px;
  do {
    if (psVar4 < s->img_buffer_end) {
LAB_00136d56:
      psVar4 = psVar4 + 1;
      s->img_buffer = psVar4;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar4 = s->img_buffer;
      goto LAB_00136d56;
    }
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00136d97:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_00136df1:
      pcVar5 = "bad file";
      goto LAB_00136df8;
    }
  }
  else {
    iVar14 = (*(s->io).eof)(s->io_user_data);
    if (iVar14 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_00136d97;
      goto LAB_00136df1;
    }
  }
  bVar3 = 0;
  uVar15 = 0;
  if ((y != 0) && (uVar15 = y * x, 0x1fffffff < uVar15 || (uint)(0x7fffffff / (ulong)y) < x)) {
    pcVar5 = "too large";
LAB_00136df8:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar5;
    return (void *)0x0;
  }
  local_98 = (uint *)comp;
  local_68 = (uint *)py;
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  local_a0 = (uchar *)stbi__malloc_mad3(x,y,4,0);
  memset(local_a0,0xff,(ulong)(uVar15 << 2));
  pbVar20 = (byte *)(local_57 + 1);
  lVar7 = 0;
  do {
    if (lVar7 == 10) {
LAB_00136fcc:
      pcVar5 = "bad format";
LAB_00136fdc:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar5;
      goto LAB_00136fea;
    }
    pbVar6 = s->img_buffer;
    pbVar11 = s->img_buffer_end;
    local_90 = lVar7;
    if (pbVar6 < pbVar11) {
LAB_00136ea2:
      s->img_buffer = pbVar6 + 1;
      bVar23 = *pbVar6 == 0;
      pbVar6 = pbVar6 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar6 = s->img_buffer;
        pbVar11 = s->img_buffer_end;
        goto LAB_00136ea2;
      }
      bVar23 = true;
    }
    if (pbVar6 < pbVar11) {
LAB_00136edd:
      s->img_buffer = pbVar6 + 1;
      bVar21 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar6 = s->img_buffer;
        pbVar11 = s->img_buffer_end;
        goto LAB_00136edd;
      }
      bVar21 = 0;
    }
    pbVar20[-2] = bVar21;
    if (pbVar6 < pbVar11) {
LAB_00136f19:
      s->img_buffer = pbVar6 + 1;
      bVar13 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar6 = s->img_buffer;
        pbVar11 = s->img_buffer_end;
        goto LAB_00136f19;
      }
      bVar13 = 0;
    }
    pbVar20[-1] = bVar13;
    if (pbVar6 < pbVar11) {
LAB_00136f4d:
      s->img_buffer = pbVar6 + 1;
      bVar13 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar6 = s->img_buffer;
        goto LAB_00136f4d;
      }
      bVar13 = 0;
    }
    *pbVar20 = bVar13;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00136f82:
      if (pbVar6 < s->img_buffer_end) goto LAB_00136f8b;
LAB_00136fd5:
      pcVar5 = "bad file";
      goto LAB_00136fdc;
    }
    iVar14 = (*(s->io).eof)(s->io_user_data);
    if (iVar14 != 0) {
      if (s->read_from_callbacks != 0) {
        pbVar6 = s->img_buffer;
        goto LAB_00136f82;
      }
      goto LAB_00136fd5;
    }
LAB_00136f8b:
    if (bVar21 != 8) goto LAB_00136fcc;
    bVar3 = bVar3 | bVar13;
    pbVar20 = pbVar20 + 3;
    lVar7 = local_90 + 1;
  } while (!bVar23);
  uVar15 = 4 - ((bVar3 & 0x10) == 0);
  if (local_98 != (uint *)0x0) {
    *local_98 = uVar15;
  }
  local_90 = lVar7;
  if (y != 0) {
    local_84 = x * 4;
    local_80 = (ulong)y;
    uVar12 = 0;
    do {
      local_a8 = local_a0 + local_84 * (int)uVar12;
      lVar7 = 0;
      local_78 = uVar12;
      do {
        lVar2 = lVar7 * 3;
        cVar1 = local_57[lVar2];
        local_70 = lVar7;
        if (cVar1 != '\0') {
          if (cVar1 == '\x01') {
            psVar4 = local_a8;
            uVar17 = x;
            if (x != 0) {
              do {
                pbVar20 = s->img_buffer;
                if (pbVar20 < s->img_buffer_end) {
LAB_0013727f:
                  s->img_buffer = pbVar20 + 1;
                  bVar3 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar20 = s->img_buffer;
                    goto LAB_0013727f;
                  }
                  bVar3 = 0;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001372b5:
                  if (s->img_buffer_end <= pbVar20) goto LAB_001373b4;
                }
                else {
                  iVar14 = (*(s->io).eof)(s->io_user_data);
                  if (iVar14 != 0) {
                    if (s->read_from_callbacks != 0) {
                      pbVar20 = s->img_buffer;
                      goto LAB_001372b5;
                    }
                    goto LAB_001373b4;
                  }
                }
                psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_ac);
                if (psVar9 == (stbi_uc *)0x0) goto LAB_001373c9;
                if (uVar17 < bVar3) {
                  bVar3 = (byte)uVar17;
                }
                uVar22 = (uint)bVar3;
                if (bVar3 != 0) {
                  uVar10 = 0;
                  do {
                    bVar3 = local_57[lVar2 + 1];
                    uVar19 = 0x80;
                    lVar7 = 0;
                    do {
                      if ((uVar19 & bVar3) != 0) {
                        psVar4[lVar7] = local_ac[lVar7];
                      }
                      lVar7 = lVar7 + 1;
                      uVar19 = uVar19 >> 1;
                    } while (lVar7 != 4);
                    uVar10 = uVar10 + 1;
                    psVar4 = psVar4 + 4;
                  } while (uVar10 != uVar22);
                }
                uVar10 = uVar17 - uVar22;
                bVar23 = (int)uVar22 <= (int)uVar17;
                uVar17 = uVar10;
              } while (uVar10 != 0 && bVar23);
            }
            goto LAB_00137364;
          }
          if (cVar1 == '\x02') {
            psVar4 = local_a8;
            uVar17 = x;
            if (x != 0) {
              do {
                pbVar20 = s->img_buffer;
                if (pbVar20 < s->img_buffer_end) {
LAB_00137138:
                  s->img_buffer = pbVar20 + 1;
                  bVar3 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar20 = s->img_buffer;
                    goto LAB_00137138;
                  }
                  bVar3 = 0;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013716d:
                  if (s->img_buffer_end <= pbVar20) {
LAB_001373d3:
                    pcVar5 = "bad file";
                    goto LAB_001373e3;
                  }
                }
                else {
                  iVar14 = (*(s->io).eof)(s->io_user_data);
                  if (iVar14 != 0) {
                    if (s->read_from_callbacks != 0) {
                      pbVar20 = s->img_buffer;
                      goto LAB_0013716d;
                    }
                    goto LAB_001373d3;
                  }
                }
                uVar22 = (uint)bVar3;
                if ((char)bVar3 < '\0') {
                  if (uVar22 == 0x80) {
                    iVar14 = stbi__get16be(s);
                  }
                  else {
                    iVar14 = uVar22 - 0x7f;
                  }
                  if ((int)uVar17 < iVar14) goto LAB_001373b4;
                  psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_ac);
                  if (psVar9 == (stbi_uc *)0x0) goto LAB_001373c9;
                  if (0 < iVar14) {
                    iVar16 = 0;
                    do {
                      bVar3 = local_57[lVar2 + 1];
                      uVar22 = 0x80;
                      lVar7 = 0;
                      do {
                        if ((uVar22 & bVar3) != 0) {
                          psVar4[lVar7] = local_ac[lVar7];
                        }
                        lVar7 = lVar7 + 1;
                        uVar22 = uVar22 >> 1;
                      } while (lVar7 != 4);
                      iVar16 = iVar16 + 1;
                      psVar4 = psVar4 + 4;
                    } while (iVar16 != iVar14);
                  }
                }
                else {
                  iVar14 = uVar22 + 1;
                  iVar16 = iVar14;
                  if (uVar17 <= uVar22) goto LAB_001373b4;
                  do {
                    psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],psVar4);
                    if (psVar9 == (stbi_uc *)0x0) goto LAB_001373c9;
                    psVar4 = psVar4 + 4;
                    iVar16 = iVar16 + -1;
                  } while (iVar16 != 0);
                }
                uVar22 = uVar17 - iVar14;
                bVar23 = iVar14 <= (int)uVar17;
                uVar17 = uVar22;
              } while (uVar22 != 0 && bVar23);
            }
            goto LAB_00137364;
          }
          pcVar5 = "bad format";
LAB_001373e3:
          *(char **)(in_FS_OFFSET + -0x10) = pcVar5;
          goto LAB_001373c9;
        }
        if (x != 0) {
          bVar3 = local_57[lVar2 + 1];
          psVar4 = local_a8;
          uVar17 = x;
          do {
            psVar9 = stbi__readval(s,(uint)bVar3,psVar4);
            if (psVar9 == (stbi_uc *)0x0) goto LAB_001373c9;
            psVar4 = psVar4 + 4;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
LAB_00137364:
        lVar7 = local_70 + 1;
      } while (local_90 != lVar7);
      uVar12 = local_78 + 1;
    } while (uVar12 != local_80);
  }
  puVar18 = local_98;
  puVar8 = local_a0;
  if (local_a0 != (uchar *)0x0) goto LAB_00136fff;
  goto LAB_00136ff8;
LAB_001373b4:
  *(char **)(in_FS_OFFSET + -0x10) = "bad file";
LAB_001373c9:
  pbVar20 = (byte *)(ulong)uVar15;
LAB_00136fea:
  uVar15 = (uint)pbVar20;
LAB_00136ff8:
  puVar18 = local_98;
  free(local_a0);
  puVar8 = (uchar *)0x0;
LAB_00136fff:
  *local_60 = x;
  *local_68 = y;
  if (req_comp != 0) {
    uVar15 = req_comp;
  }
  if (req_comp == 0 && puVar18 != (uint *)0x0) {
    uVar15 = *puVar18;
  }
  puVar8 = stbi__convert_format(puVar8,4,uVar15,x,y);
  return puVar8;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}